

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O0

shared_ptr<Expr> __thiscall Parser::term(Parser *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Parser *in_RSI;
  bool bVar3;
  shared_ptr<Expr> sVar4;
  undefined1 local_60 [48];
  undefined1 local_30 [8];
  shared_ptr<Token> tok;
  Parser *this_local;
  shared_ptr<Expr> *x;
  
  tok.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 0;
  unary(this);
  while( true ) {
    peVar1 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &in_RSI->look);
    bVar3 = true;
    _Var2._M_pi = extraout_RDX;
    if (peVar1->tag != 0x2a) {
      peVar1 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &in_RSI->look);
      bVar3 = peVar1->tag == 0x2f;
      _Var2._M_pi = extraout_RDX_00;
    }
    if (!bVar3) break;
    std::shared_ptr<Token>::shared_ptr((shared_ptr<Token> *)local_30,&in_RSI->look);
    move(in_RSI);
    unary((Parser *)local_60);
    std::make_shared<Arith,std::shared_ptr<Token>&,std::shared_ptr<Expr>&,std::shared_ptr<Expr>>
              ((shared_ptr<Token> *)(local_60 + 0x10),(shared_ptr<Expr> *)local_30,
               (shared_ptr<Expr> *)this);
    std::shared_ptr<Expr>::operator=
              ((shared_ptr<Expr> *)this,(shared_ptr<Arith> *)(local_60 + 0x10));
    std::shared_ptr<Arith>::~shared_ptr((shared_ptr<Arith> *)(local_60 + 0x10));
    std::shared_ptr<Expr>::~shared_ptr((shared_ptr<Expr> *)local_60);
    std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_30);
  }
  sVar4.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar4.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Expr>)sVar4.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Expr> term() {
		std::shared_ptr<Expr> x = unary();
		while (look->tag == '*' || look->tag == '/') {
			std::shared_ptr<Token> tok = look; move();
			x = std::make_shared<Arith>(tok, x, unary());
		}
		return x;
	}